

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.h
# Opt level: O2

int http1_consume_header_trailer
              (http1_parser_s *parser,uint8_t *start,uint8_t *end_name,uint8_t *start_value,
              uint8_t *end)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  
  __n = (long)end_name - (long)start;
  if (((long)__n < 2) || (*start != 'x')) {
    iVar1 = 0;
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 0x10) {
      if (__n == *(size_t *)((long)&DAT_0014dca8 + lVar3)) {
        iVar2 = bcmp(start,*(void **)((long)&PTR_anon_var_dwarf_1ceb0_0014dca0 + lVar3),__n);
        if (iVar2 == 0) goto LAB_00124c2e;
      }
    }
  }
  else {
LAB_00124c2e:
    iVar1 = http1_on_header(parser,(char *)start,__n,(char *)start_value,
                            (long)end - (long)start_value);
    iVar1 = -(uint)(iVar1 != 0);
  }
  return iVar1;
}

Assistant:

inline static int http1_consume_header_trailer(http1_parser_s *parser,
                                               uint8_t *start,
                                               uint8_t *end_name,
                                               uint8_t *start_value,
                                               uint8_t *end) {
  if ((end_name - start) > 1 && start[0] == 'x') {
    /* X- headers are allowed */
    goto white_listed;
  }

  /* white listed trailer names */
  const struct {
    char *name;
    long len;
  } http1_trailer_white_list[] = {
      {"server-timing", 13}, /* specific for client data... */
      {NULL, 0},             /* end of list marker */
  };
  for (size_t i = 0; http1_trailer_white_list[i].name; ++i) {
    if ((long)(end_name - start) == http1_trailer_white_list[i].len &&
        HEADER_NAME_IS_EQ((char *)start, http1_trailer_white_list[i].name,
                          http1_trailer_white_list[i].len)) {
      /* header disallowed here */
      goto white_listed;
    }
  }
  return 0;
white_listed:
  /* perform callback */
  if (http1_on_header(parser, (char *)start, (end_name - start),
                      (char *)start_value, end - start_value))
    return -1;
  return 0;
}